

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O3

void dradf2(int ido,int l1,float *cc,float *ch,float *wa1)

{
  int iVar1;
  ulong uVar2;
  float *pfVar3;
  uint uVar4;
  ulong uVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  
  uVar9 = l1 * ido;
  iVar1 = ido * 2;
  if (0 < l1) {
    iVar7 = 0;
    pfVar3 = cc;
    iVar8 = l1;
    do {
      ch[iVar7] = *pfVar3 + pfVar3[(int)uVar9];
      iVar7 = iVar7 + iVar1;
      ch[(long)iVar7 + -1] = *pfVar3 - pfVar3[(int)uVar9];
      pfVar3 = pfVar3 + ido;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (1 < ido) {
    if (ido == 2) {
      if (l1 < 1) {
        return;
      }
    }
    else {
      if (0 < l1) {
        uVar2 = (ulong)(uint)ido;
        pfVar3 = cc + uVar9;
        uVar4 = 0;
        iVar7 = 0;
        pfVar10 = cc;
        iVar8 = iVar1;
        do {
          pfVar6 = ch + (long)iVar8 + -2;
          uVar5 = 2;
          do {
            fVar12 = wa1[uVar5 - 2] * pfVar3[uVar5 - 1] + wa1[uVar5 - 1] * pfVar3[uVar5];
            fVar11 = wa1[uVar5 - 2] * pfVar3[uVar5] - pfVar3[uVar5 - 1] * wa1[uVar5 - 1];
            ch[uVar4 + uVar5] = pfVar10[uVar5] + fVar11;
            *pfVar6 = fVar11 - pfVar10[uVar5];
            ch[(ulong)uVar4 + (uVar5 - 1)] = pfVar10[uVar5 - 1] + fVar12;
            pfVar6[-1] = pfVar10[uVar5 - 1] - fVar12;
            uVar5 = uVar5 + 2;
            pfVar6 = pfVar6 + -2;
          } while (uVar5 < uVar2);
          iVar7 = iVar7 + 1;
          uVar4 = uVar4 + iVar1;
          iVar8 = iVar8 + iVar1;
          pfVar3 = pfVar3 + uVar2;
          pfVar10 = pfVar10 + uVar2;
        } while (iVar7 != l1);
      }
      if (l1 < 1 || (ido & 1U) != 0) {
        return;
      }
    }
    pfVar3 = ch + (uint)ido;
    do {
      *pfVar3 = -cc[(int)(uVar9 + ido + -1)];
      pfVar3[-1] = cc[ido - 1];
      pfVar3 = pfVar3 + iVar1;
      cc = cc + (uint)ido;
      l1 = l1 + -1;
    } while (l1 != 0);
  }
  return;
}

Assistant:

static void dradf2(int ido,int l1,float *cc,float *ch,float *wa1){
  int i,k;
  float ti2,tr2;
  int t0,t1,t2,t3,t4,t5,t6;

  t1=0;
  t0=(t2=l1*ido);
  t3=ido<<1;
  for(k=0;k<l1;k++){
    ch[t1<<1]=cc[t1]+cc[t2];
    ch[(t1<<1)+t3-1]=cc[t1]-cc[t2];
    t1+=ido;
    t2+=ido;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  t2=t0;
  for(k=0;k<l1;k++){
    t3=t2;
    t4=(t1<<1)+(ido<<1);
    t5=t1;
    t6=t1+t1;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4-=2;
      t5+=2;
      t6+=2;
      tr2=wa1[i-2]*cc[t3-1]+wa1[i-1]*cc[t3];
      ti2=wa1[i-2]*cc[t3]-wa1[i-1]*cc[t3-1];
      ch[t6]=cc[t5]+ti2;
      ch[t4]=ti2-cc[t5];
      ch[t6-1]=cc[t5-1]+tr2;
      ch[t4-1]=cc[t5-1]-tr2;
    }
    t1+=ido;
    t2+=ido;
  }

  if(ido%2==1)return;

 L105:
  t3=(t2=(t1=ido)-1);
  t2+=t0;
  for(k=0;k<l1;k++){
    ch[t1]=-cc[t2];
    ch[t1-1]=cc[t3];
    t1+=ido<<1;
    t2+=ido;
    t3+=ido;
  }
}